

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::InstanceArrayIntersectorK<8>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  undefined1 (*pauVar2) [32];
  undefined4 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [32];
  ulong uVar17;
  Primitive_conflict4 *prim;
  ulong *puVar18;
  bool bVar19;
  undefined1 auVar20 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar38 [64];
  Precalculations pre;
  vbool<8> valid_leaf;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5951;
  RayHitK<8> *local_5950;
  RayQueryContext *local_5948;
  anon_union_32_3_898e2e57_for_vboolf_impl<8>_1 local_5940;
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  float local_5860;
  float fStack_585c;
  float fStack_5858;
  float fStack_5854;
  float fStack_5850;
  float fStack_584c;
  float fStack_5848;
  uint uStack_5844;
  float local_5840;
  float fStack_583c;
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  uint uStack_5824;
  ulong auStack_5820 [564];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  auStack_5820[3] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (auStack_5820[3] != 8) {
    local_5950 = ray;
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar23 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
      auVar23 = vpcmpeqd_avx2(auVar23,(undefined1  [32])valid_i->field_0);
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar20._8_4_ = 0x7fffffff;
        auVar20._0_8_ = 0x7fffffff7fffffff;
        auVar20._12_4_ = 0x7fffffff;
        auVar20._16_4_ = 0x7fffffff;
        auVar20._20_4_ = 0x7fffffff;
        auVar20._24_4_ = 0x7fffffff;
        auVar20._28_4_ = 0x7fffffff;
        auVar22 = vandps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar20);
        auVar30._8_4_ = 0x219392ef;
        auVar30._0_8_ = 0x219392ef219392ef;
        auVar30._12_4_ = 0x219392ef;
        auVar30._16_4_ = 0x219392ef;
        auVar30._20_4_ = 0x219392ef;
        auVar30._24_4_ = 0x219392ef;
        auVar30._28_4_ = 0x219392ef;
        auVar22 = vcmpps_avx(auVar22,auVar30,1);
        auVar4 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0x80),auVar30,auVar22);
        auVar22 = vandps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar20);
        auVar22 = vcmpps_avx(auVar22,auVar30,1);
        auVar25 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xa0),auVar30,auVar22);
        auVar22 = vandps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar20);
        auVar22 = vcmpps_avx(auVar22,auVar30,1);
        auVar20 = vrcpps_avx(auVar4);
        auVar22 = vblendvps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar30,auVar22);
        auVar24._8_4_ = 0x3f800000;
        auVar24._0_8_ = 0x3f8000003f800000;
        auVar24._12_4_ = 0x3f800000;
        auVar24._16_4_ = 0x3f800000;
        auVar24._20_4_ = 0x3f800000;
        auVar24._24_4_ = 0x3f800000;
        auVar24._28_4_ = 0x3f800000;
        auVar8 = vfnmadd213ps_fma(auVar4,auVar20,auVar24);
        auVar4 = vrcpps_avx(auVar25);
        auVar9 = vfnmadd213ps_fma(auVar25,auVar4,auVar24);
        auVar25 = vrcpps_avx(auVar22);
        auVar10 = vfnmadd213ps_fma(auVar22,auVar25,auVar24);
        auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar20,auVar20);
        auVar32 = ZEXT1664(auVar8);
        auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar4,auVar4);
        auVar33 = ZEXT1664(auVar9);
        auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar25,auVar25);
        auVar34 = ZEXT1664(auVar10);
        auVar22 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),ZEXT832(0) << 0x20);
        auVar4 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT832(0) << 0x20);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar35 = ZEXT3264(local_4680);
        local_5900 = vblendvps_avx(local_4680,auVar22,auVar23);
        auVar36 = ZEXT3264(local_5900);
        auVar22._8_4_ = 0xff800000;
        auVar22._0_8_ = 0xff800000ff800000;
        auVar22._12_4_ = 0xff800000;
        auVar22._16_4_ = 0xff800000;
        auVar22._20_4_ = 0xff800000;
        auVar22._24_4_ = 0xff800000;
        auVar22._28_4_ = 0xff800000;
        auVar23 = vblendvps_avx(auVar22,auVar4,auVar23);
        auVar37 = ZEXT3264(auVar23);
        puVar18 = auStack_5820 + 4;
        pauVar16 = (undefined1 (*) [32])local_4640;
        uStack_5824 = *(uint *)(ray + 0x1c) ^ 0x80000000;
        auVar23 = *(undefined1 (*) [32])(ray + 0x20);
        auVar38._0_4_ = auVar8._0_4_ * -*(float *)ray;
        auVar38._4_4_ = auVar8._4_4_ * -*(float *)(ray + 4);
        auVar38._8_4_ = auVar8._8_4_ * -*(float *)(ray + 8);
        auVar38._12_4_ = auVar8._12_4_ * -*(float *)(ray + 0xc);
        auVar38._16_4_ = -*(float *)(ray + 0x10) * 0.0;
        auVar38._20_4_ = -*(float *)(ray + 0x14) * 0.0;
        auVar38._28_36_ = in_ZMM15._28_36_;
        auVar38._24_4_ = -*(float *)(ray + 0x18) * 0.0;
        local_5920 = auVar38._0_32_;
        auVar38 = ZEXT3264(local_5920);
        local_5840 = auVar9._0_4_ * -auVar23._0_4_;
        fStack_583c = auVar9._4_4_ * -auVar23._4_4_;
        fStack_5838 = auVar9._8_4_ * -auVar23._8_4_;
        fStack_5834 = auVar9._12_4_ * -auVar23._12_4_;
        fStack_5830 = -auVar23._16_4_ * 0.0;
        fStack_582c = -auVar23._20_4_ * 0.0;
        fStack_5828 = -auVar23._24_4_ * 0.0;
        uStack_5844 = *(uint *)(ray + 0x5c) ^ 0x80000000;
        local_5860 = auVar10._0_4_ * -*(float *)(ray + 0x40);
        fStack_585c = auVar10._4_4_ * -*(float *)(ray + 0x44);
        fStack_5858 = auVar10._8_4_ * -*(float *)(ray + 0x48);
        fStack_5854 = auVar10._12_4_ * -*(float *)(ray + 0x4c);
        fStack_5850 = -*(float *)(ray + 0x50) * 0.0;
        fStack_584c = -*(float *)(ray + 0x54) * 0.0;
        fStack_5848 = -*(float *)(ray + 0x58) * 0.0;
        auStack_5820[2] = 0xfffffffffffffff8;
        local_4660 = local_5900;
        local_58a0 = ZEXT1632(auVar8);
        local_58c0 = ZEXT1632(auVar9);
        local_58e0 = ZEXT1632(auVar10);
        local_5948 = context;
LAB_016b355d:
        puVar1 = puVar18 + -1;
        if (*puVar1 != 0xfffffffffffffff8) {
          puVar18 = puVar18 + -1;
          pauVar2 = pauVar16 + -1;
          auVar21 = ZEXT3264(*pauVar2);
          pauVar16 = pauVar16 + -1;
          local_5880 = auVar37._0_32_;
          auVar23 = vcmpps_avx(*pauVar2,local_5880,1);
          uVar17 = *puVar1;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar23 >> 0x7f,0) != '\0') ||
                (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar23 >> 0xbf,0) != '\0') ||
              (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar23[0x1f] < '\0') {
            while ((uVar17 & 8) == 0) {
              auVar21 = ZEXT3264(auVar35._0_32_);
              uVar15 = 0;
              uVar11 = 8;
              for (lVar12 = 0;
                  (lVar12 != 8 &&
                  (uVar14 = *(ulong *)((uVar17 & 0xfffffffffffffff0) + lVar12 * 8), uVar14 != 8));
                  lVar12 = lVar12 + 1) {
                uVar3 = *(undefined4 *)(uVar17 + 0x40 + lVar12 * 4);
                auVar25._4_4_ = uVar3;
                auVar25._0_4_ = uVar3;
                auVar25._8_4_ = uVar3;
                auVar25._12_4_ = uVar3;
                auVar25._16_4_ = uVar3;
                auVar25._20_4_ = uVar3;
                auVar25._24_4_ = uVar3;
                auVar25._28_4_ = uVar3;
                uVar3 = *(undefined4 *)(uVar17 + 0x80 + lVar12 * 4);
                auVar26._4_4_ = uVar3;
                auVar26._0_4_ = uVar3;
                auVar26._8_4_ = uVar3;
                auVar26._12_4_ = uVar3;
                auVar26._16_4_ = uVar3;
                auVar26._20_4_ = uVar3;
                auVar26._24_4_ = uVar3;
                auVar26._28_4_ = uVar3;
                auVar8 = vfmadd213ps_fma(auVar25,auVar32._0_32_,auVar38._0_32_);
                auVar4._4_4_ = fStack_583c;
                auVar4._0_4_ = local_5840;
                auVar4._8_4_ = fStack_5838;
                auVar4._12_4_ = fStack_5834;
                auVar4._16_4_ = fStack_5830;
                auVar4._20_4_ = fStack_582c;
                auVar4._24_4_ = fStack_5828;
                auVar4._28_4_ = uStack_5824;
                auVar9 = vfmadd213ps_fma(auVar26,auVar33._0_32_,auVar4);
                uVar3 = *(undefined4 *)(uVar17 + 0xc0 + lVar12 * 4);
                auVar27._4_4_ = uVar3;
                auVar27._0_4_ = uVar3;
                auVar27._8_4_ = uVar3;
                auVar27._12_4_ = uVar3;
                auVar27._16_4_ = uVar3;
                auVar27._20_4_ = uVar3;
                auVar27._24_4_ = uVar3;
                auVar27._28_4_ = uVar3;
                auVar23._4_4_ = fStack_585c;
                auVar23._0_4_ = local_5860;
                auVar23._8_4_ = fStack_5858;
                auVar23._12_4_ = fStack_5854;
                auVar23._16_4_ = fStack_5850;
                auVar23._20_4_ = fStack_584c;
                auVar23._24_4_ = fStack_5848;
                auVar23._28_4_ = uStack_5844;
                auVar10 = vfmadd213ps_fma(auVar27,auVar34._0_32_,auVar23);
                uVar3 = *(undefined4 *)(uVar17 + 0x60 + lVar12 * 4);
                auVar28._4_4_ = uVar3;
                auVar28._0_4_ = uVar3;
                auVar28._8_4_ = uVar3;
                auVar28._12_4_ = uVar3;
                auVar28._16_4_ = uVar3;
                auVar28._20_4_ = uVar3;
                auVar28._24_4_ = uVar3;
                auVar28._28_4_ = uVar3;
                auVar5 = vfmadd213ps_fma(auVar28,auVar32._0_32_,auVar38._0_32_);
                uVar3 = *(undefined4 *)(uVar17 + 0xa0 + lVar12 * 4);
                auVar29._4_4_ = uVar3;
                auVar29._0_4_ = uVar3;
                auVar29._8_4_ = uVar3;
                auVar29._12_4_ = uVar3;
                auVar29._16_4_ = uVar3;
                auVar29._20_4_ = uVar3;
                auVar29._24_4_ = uVar3;
                auVar29._28_4_ = uVar3;
                uVar3 = *(undefined4 *)(uVar17 + 0xe0 + lVar12 * 4);
                auVar31._4_4_ = uVar3;
                auVar31._0_4_ = uVar3;
                auVar31._8_4_ = uVar3;
                auVar31._12_4_ = uVar3;
                auVar31._16_4_ = uVar3;
                auVar31._20_4_ = uVar3;
                auVar31._24_4_ = uVar3;
                auVar31._28_4_ = uVar3;
                auVar6 = vfmadd213ps_fma(auVar29,auVar33._0_32_,auVar4);
                auVar7 = vfmadd213ps_fma(auVar31,auVar34._0_32_,auVar23);
                auVar23 = vpminsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar5));
                auVar22 = vpminsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar6));
                auVar23 = vpmaxsd_avx2(auVar23,auVar22);
                auVar22 = vpminsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar7));
                auVar22 = vpmaxsd_avx2(auVar23,auVar22);
                auVar23 = vpmaxsd_avx2(ZEXT1632(auVar8),ZEXT1632(auVar5));
                auVar4 = vpmaxsd_avx2(ZEXT1632(auVar9),ZEXT1632(auVar6));
                auVar25 = vpminsd_avx2(auVar23,auVar4);
                auVar23 = vpmaxsd_avx2(ZEXT1632(auVar10),ZEXT1632(auVar7));
                auVar4 = vpmaxsd_avx2(auVar22,auVar36._0_32_);
                auVar23 = vpminsd_avx2(auVar23,local_5880);
                auVar23 = vpminsd_avx2(auVar25,auVar23);
                auVar23 = vcmpps_avx(auVar4,auVar23,2);
                if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar23 >> 0x7f,0) != '\0') ||
                      (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0xbf,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar23[0x1f] < '\0') {
                  auVar23 = vblendvps_avx(auVar35._0_32_,auVar22,auVar23);
                  auVar20 = auVar21._0_32_;
                  auVar22 = vcmpps_avx(auVar23,auVar20,1);
                  uVar13 = uVar11;
                  auVar25 = auVar20;
                  auVar4 = auVar23;
                  if (((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                            (auVar22 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar22 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          SUB321(auVar22 >> 0x7f,0) == '\0') &&
                         (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        SUB321(auVar22 >> 0xbf,0) == '\0') &&
                       (auVar22 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       -1 < auVar22[0x1f]) ||
                     (uVar13 = uVar14, uVar14 = uVar11, auVar25 = auVar23, auVar4 = auVar20,
                     uVar11 != 8)) {
                    auVar23 = auVar25;
                    uVar15 = uVar15 + 1;
                    *puVar18 = uVar14;
                    puVar18 = puVar18 + 1;
                    *pauVar16 = auVar4;
                    pauVar16 = pauVar16 + 1;
                  }
                  uVar11 = uVar13;
                  auVar21 = ZEXT3264(auVar23);
                }
              }
              if (uVar11 == 8) goto LAB_016b355d;
              uVar17 = uVar11;
              if (1 < uVar15) {
                auVar23 = pauVar16[-2];
                auVar22 = pauVar16[-1];
                auVar25 = vcmpps_avx(auVar23,auVar22,1);
                auVar4 = auVar22;
                if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar25 >> 0x7f,0) != '\0') ||
                      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0xbf,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar25[0x1f] < '\0') {
                  pauVar16[-2] = auVar22;
                  pauVar16[-1] = auVar23;
                  auVar8 = vpermilps_avx(*(undefined1 (*) [16])(puVar18 + -2),0x4e);
                  *(undefined1 (*) [16])(puVar18 + -2) = auVar8;
                  auVar4 = auVar23;
                  auVar23 = auVar22;
                }
                if (uVar15 != 2) {
                  auVar22 = pauVar16[-3];
                  auVar25 = vcmpps_avx(auVar22,auVar4,1);
                  if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar25 >> 0x7f,0) != '\0') ||
                        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar25 >> 0xbf,0) != '\0') ||
                      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar25[0x1f] < '\0') {
                    pauVar16[-3] = auVar4;
                    pauVar16[-1] = auVar22;
                    uVar11 = puVar18[-3];
                    puVar18[-3] = puVar18[-1];
                    puVar18[-1] = uVar11;
                    auVar22 = auVar4;
                  }
                  auVar4 = vcmpps_avx(auVar22,auVar23,1);
                  if ((((((((auVar4 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar4 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar4 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar4 >> 0x7f,0) != '\0') ||
                        (auVar4 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar4 >> 0xbf,0) != '\0') ||
                      (auVar4 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar4[0x1f] < '\0') {
                    pauVar16[-3] = auVar23;
                    pauVar16[-2] = auVar22;
                    auVar8 = vpermilps_avx(*(undefined1 (*) [16])(puVar18 + -3),0x4e);
                    *(undefined1 (*) [16])(puVar18 + -3) = auVar8;
                  }
                }
              }
            }
            if (uVar17 == 0xfffffffffffffff8) {
              return;
            }
            local_5940 = (anon_union_32_3_898e2e57_for_vboolf_impl<8>_1)
                         vcmpps_avx(local_5880,auVar21._0_32_,6);
            if (((((((((undefined1  [32])local_5940 >> 0x1f & (undefined1  [32])0x1) !=
                      (undefined1  [32])0x0 ||
                     ((undefined1  [32])local_5940 >> 0x3f & (undefined1  [32])0x1) !=
                     (undefined1  [32])0x0) ||
                    ((undefined1  [32])local_5940 >> 0x5f & (undefined1  [32])0x1) !=
                    (undefined1  [32])0x0) || SUB321((undefined1  [32])local_5940 >> 0x7f,0) != '\0'
                   ) || ((undefined1  [32])local_5940 & (undefined1  [32])0x100000000) !=
                        (undefined1  [32])0x0) ||
                 SUB321((undefined1  [32])local_5940 >> 0xbf,0) != '\0') ||
                ((undefined1  [32])local_5940 & (undefined1  [32])0x100000000) !=
                (undefined1  [32])0x0) || local_5940.i[7]._3_1_ < '\0') {
              lVar12 = (ulong)((uint)uVar17 & 0xf) - 8;
              prim = (Primitive_conflict4 *)(uVar17 & 0xfffffffffffffff0);
              while (bVar19 = lVar12 != 0, lVar12 = lVar12 + -1, bVar19) {
                InstanceArrayIntersectorK<8>::intersect
                          ((vbool<8> *)&local_5940.field_1,&local_5951,local_5950,context,prim);
                auVar37 = ZEXT3264(local_5880);
                auVar35 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                prim = prim + 1;
                context = local_5948;
              }
              auVar23 = vblendvps_avx(auVar37._0_32_,*(undefined1 (*) [32])(local_5950 + 0x100),
                                      (undefined1  [32])local_5940);
              auVar37 = ZEXT3264(auVar23);
              auVar32 = ZEXT3264(local_58a0);
              auVar33 = ZEXT3264(local_58c0);
              auVar34 = ZEXT3264(local_58e0);
              auVar36 = ZEXT3264(local_5900);
              auVar38 = ZEXT3264(local_5920);
            }
          }
          goto LAB_016b355d;
        }
      }
    }
    else {
      intersectCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }